

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

GeluLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_gelu(NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x31b) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x31b;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.gelu_ = google::protobuf::Arena::
                  CreateMaybeMessage<CoreML::Specification::GeluLayerParams>(arena);
    (this->layer_).gelu_ = (GeluLayerParams *)LVar2;
  }
  return (GeluLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::GeluLayerParams* NeuralNetworkLayer::_internal_mutable_gelu() {
  if (!_internal_has_gelu()) {
    clear_layer();
    set_has_gelu();
    layer_.gelu_ = CreateMaybeMessage< ::CoreML::Specification::GeluLayerParams >(GetArenaForAllocation());
  }
  return layer_.gelu_;
}